

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void install_phaser_inter(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_Method_Wrapper *pAVar5;
  Am_Constraint *pAVar6;
  ulong uVar7;
  Am_Slot_Flags flags;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28 [3];
  Am_Object local_10;
  
  Am_Object::Create((char *)&local_10);
  uVar2 = Am_Object::Set((ushort)&local_10,true,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Federation_Phaser_Style);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar3);
  Am_Object::operator=(&SP_Federation_Phaser_Beam,pAVar4);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Create((char *)local_28);
  uVar2 = Am_Object::Set((ushort)local_28,true,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Klingon_Phaser_Style);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar3);
  Am_Object::operator=(&SP_Klingon_Phaser_Beam,pAVar4);
  Am_Object::~Am_Object(local_28);
  Am_Object::Create((char *)&local_40);
  uVar2 = Am_Object::Set((ushort)&local_40,(char *)0xb9,0x10e2d3);
  pAVar5 = Am_Where_Method::operator_cast_to_Am_Method_Wrapper_
                     ((Am_Where_Method *)&Am_Inter_In_Part);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xba,(ulong)pAVar5);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)pick_phaser_beam);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0xdc,(ulong)pAVar6);
  uVar2 = Am_Object::Set(uVar2,true,1);
  uVar7 = Am_Object::Set(uVar2,0xde,0);
  Am_Object::Get_Object((ushort)&local_38,uVar7);
  pAVar5 = Am_Current_Location_Method::operator_cast_to_Am_Method_Wrapper_(&destroy_ship);
  uVar2 = Am_Object::Set((ushort)&local_38,(Am_Method_Wrapper *)0xca,(ulong)pAVar5);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&hide_ship_command);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0x146,(ulong)pAVar5);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&hide_ship_command);
  flags = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0x147,(ulong)pAVar5);
  Am_Object::Get_Owner(&local_30,flags);
  Am_Object::operator=(&SP_Phaser_Inter,(Am_Object *)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&local_48,(Am_Object *)&SP_Federation_Phaser_Beam);
  pAVar4 = (Am_Object *)Am_Object::Add_Part((Am_Object *)&SP_Clip_Win,SUB81(&local_48,0),1);
  Am_Object::Am_Object(&local_50,(Am_Object *)&SP_Klingon_Phaser_Beam);
  Am_Object::Add_Part(pAVar4,SUB81(&local_50,0),1);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_48);
  AVar1 = PHASER_INTER;
  Am_Object::Am_Object(&local_58,(Am_Object *)&SP_Phaser_Inter);
  Am_Object::Add_Part(0x33f0,(Am_Object *)(ulong)AVar1,(ulong)&local_58);
  Am_Object::~Am_Object(&local_58);
  return;
}

Assistant:

void
install_phaser_inter()
{
  // Add the phaser beams to the SP_Clip_Win so that it is not iterated
  // over by do_springy when the tractor beam endpoints are adjusted, and
  //
  SP_Federation_Phaser_Beam =
      Am_Line.Create("SP_Phaser_Beam")
          .Set(Am_VISIBLE, false) // Set by interactor
          .Set(Am_LINE_STYLE, SP_Federation_Phaser_Style);
  SP_Klingon_Phaser_Beam = Am_Line.Create("SP_Phaser_Beam")
                               .Set(Am_VISIBLE, false) // Set by interactor
                               .Set(Am_LINE_STYLE, SP_Klingon_Phaser_Style);
  SP_Phaser_Inter = Am_New_Points_Interactor
                        .Create("SP_Phaser_Inter")
#if defined(_WINDOWS)
                        .Set(Am_START_WHEN, "META_LEFT_DOWN")
#else
                        .Set(Am_START_WHEN, "MIDDLE_DOWN")
#endif
                        .Set(Am_START_WHERE_TEST, Am_Inter_In_Part)
                        .Set(Am_FEEDBACK_OBJECT, (pick_phaser_beam))

                        .Set(Am_AS_LINE, true)
                        .Set(Am_CREATE_NEW_OBJECT_METHOD,
                             0L) //not really creating something
                        .Get_Object(Am_COMMAND)
                        .Set(Am_DO_METHOD, destroy_ship)
                        .Set(Am_UNDO_METHOD, hide_ship_command)
                        .Set(Am_REDO_METHOD, hide_ship_command)
                        .Get_Owner(); // Return inter to bind SP_Phaser_Inter

  SP_Clip_Win.Add_Part(SP_Federation_Phaser_Beam)
      .Add_Part(SP_Klingon_Phaser_Beam);
  SP_Ship_Agg.Add_Part(PHASER_INTER, SP_Phaser_Inter);
}